

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O3

void phmap::priv::
     Deallocate<8ul,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::pair<int,int>const,std::pair<int,int>>>>
               (PropagatingCountingAlloc<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>
                *alloc,void *p,size_t n)

{
  long *plVar1;
  ulong uVar2;
  
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0x106f,
                  "void phmap::priv::Deallocate(Alloc *, void *, size_t) [Alignment = 8UL, Alloc = phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::pair<int, int>, std::pair<int, int>>>]"
                 );
  }
  plVar1 = (alloc->
           super_CountingAllocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>).
           bytes_used_;
  uVar2 = n + 7 & 0xfffffffffffffff8;
  operator_delete(p,uVar2);
  if (plVar1 != (long *)0x0) {
    *plVar1 = *plVar1 - uVar2;
    return;
  }
  __assert_fail("bytes_used_ != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.h"
                ,0x1cf,
                "void phmap::priv::CountingAllocator<M>::deallocate(pointer, size_type) [T = M]");
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  AT::deallocate(mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}